

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elim.cpp
# Opt level: O1

void __thiscall
CaDiCaL::Internal::mark_eliminated_clauses_as_garbage
          (Internal *this,Eliminator *eliminator,int pivot,bool *deleted_binary_clause)

{
  pointer pvVar1;
  uint uVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  Clause *pCVar6;
  void *pvVar7;
  int iVar8;
  Clause *__range1;
  uint uVar9;
  Clause **c;
  pointer ppCVar10;
  ulong uVar11;
  Clause **d;
  long lVar12;
  long lVar13;
  
  ppCVar3 = (eliminator->gates).
            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar4 = (eliminator->gates).
            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  iVar8 = -pivot;
  if (0 < pivot) {
    iVar8 = pivot;
  }
  pvVar1 = (this->otab).
           super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + (iVar8 << 1 | (uint)pivot >> 0x1f);
  ppCVar5 = *(pointer *)
             ((long)&(pvVar1->
                     super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
                     _M_impl.super__Vector_impl_data + 8);
  for (ppCVar10 = (pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppCVar10 != ppCVar5;
      ppCVar10 = ppCVar10 + 1) {
    uVar9 = *(uint *)&(*ppCVar10)->field_0x8;
    if ((uVar9 & 0x10) == 0) {
      if ((ppCVar4 == ppCVar3) || ((uVar9 & 0x20) != 0)) {
        if (this->proof != (Proof *)0x0) {
          Proof::weaken_minus(this->proof,*ppCVar10);
        }
        pCVar6 = *ppCVar10;
        if (pCVar6->size == 2) {
          *deleted_binary_clause = true;
        }
        External::push_clause_on_extension_stack(this->external,pCVar6,pivot);
      }
      mark_garbage(this,*ppCVar10);
      pCVar6 = *ppCVar10;
      lVar12 = (long)pCVar6->size;
      if (lVar12 != 0) {
        lVar13 = 0;
        do {
          iVar8 = *(int *)((long)&pCVar6[1].field_0 + lVar13);
          if (iVar8 != pivot) {
            elim_update_removed_lit(this,eliminator,iVar8);
          }
          lVar13 = lVar13 + 4;
        } while (lVar12 * 4 != lVar13);
      }
    }
  }
  pvVar7 = (pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar11 = (long)*(pointer *)
                  ((long)&(pvVar1->
                          super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>)
                          ._M_impl.super__Vector_impl_data + 0x10) - (long)pvVar7;
  if (uVar11 != 0) {
    (pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>)._M_impl.
    super__Vector_impl_data._M_start = 0;
    *(pointer *)
     ((long)&(pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
             _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
             _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
    if (pvVar7 != (void *)0x0) {
      operator_delete(pvVar7,uVar11);
    }
  }
  uVar9 = -pivot;
  if (pivot < 1) {
    pivot = uVar9;
  }
  pvVar1 = (this->otab).
           super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + (pivot << 1 | uVar9 >> 0x1f);
  ppCVar5 = *(pointer *)
             ((long)&(pvVar1->
                     super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
                     _M_impl.super__Vector_impl_data + 8);
  for (ppCVar10 = (pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppCVar10 != ppCVar5;
      ppCVar10 = ppCVar10 + 1) {
    uVar2 = *(uint *)&(*ppCVar10)->field_0x8;
    if ((uVar2 & 0x10) == 0) {
      if ((ppCVar4 == ppCVar3) || ((uVar2 & 0x20) != 0)) {
        if (this->proof != (Proof *)0x0) {
          Proof::weaken_minus(this->proof,*ppCVar10);
        }
        pCVar6 = *ppCVar10;
        if (pCVar6->size == 2) {
          *deleted_binary_clause = true;
        }
        External::push_clause_on_extension_stack(this->external,pCVar6,uVar9);
      }
      mark_garbage(this,*ppCVar10);
      pCVar6 = *ppCVar10;
      lVar12 = (long)pCVar6->size;
      if (lVar12 != 0) {
        lVar13 = 0;
        do {
          uVar2 = *(uint *)((long)&pCVar6[1].field_0 + lVar13);
          if (uVar2 != uVar9) {
            elim_update_removed_lit(this,eliminator,uVar2);
          }
          lVar13 = lVar13 + 4;
        } while (lVar12 * 4 != lVar13);
      }
    }
  }
  pvVar7 = (pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar11 = (long)*(pointer *)
                  ((long)&(pvVar1->
                          super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>)
                          ._M_impl.super__Vector_impl_data + 0x10) - (long)pvVar7;
  if (uVar11 != 0) {
    (pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>)._M_impl.
    super__Vector_impl_data._M_start = 0;
    *(pointer *)
     ((long)&(pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
             _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(pvVar1->super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>).
             _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
    if (pvVar7 != (void *)0x0) {
      operator_delete(pvVar7,uVar11);
      return;
    }
  }
  return;
}

Assistant:

void Internal::mark_eliminated_clauses_as_garbage (
    Eliminator &eliminator, int pivot, bool &deleted_binary_clause) {
  assert (!unsat);

  LOG ("marking irredundant clauses with %d as garbage", pivot);

  const int64_t substitute = eliminator.gates.size ();
  if (substitute)
    LOG ("pushing %" PRId64 " gate clauses on extension stack", substitute);
#ifndef NDEBUG
  int64_t pushed = 0;
#endif
  Occs &ps = occs (pivot);
  for (const auto &c : ps) {
    if (c->garbage)
      continue;
    assert (!c->redundant);
    if (!substitute || c->gate) {
      if (proof)
        proof->weaken_minus (c);
      if (c->size == 2)
        deleted_binary_clause = true;
      external->push_clause_on_extension_stack (c, pivot);
#ifndef NDEBUG
      pushed++;
#endif
    }
    mark_garbage (c);
    elim_update_removed_clause (eliminator, c, pivot);
  }
  erase_occs (ps);

  LOG ("marking irredundant clauses with %d as garbage", -pivot);

  Occs &ns = occs (-pivot);
  for (const auto &d : ns) {
    if (d->garbage)
      continue;
    assert (!d->redundant);
    if (!substitute || d->gate) {
      if (proof)
        proof->weaken_minus (d);
      if (d->size == 2)
        deleted_binary_clause = true;
      external->push_clause_on_extension_stack (d, -pivot);
#ifndef NDEBUG
      pushed++;
#endif
    }
    mark_garbage (d);
    elim_update_removed_clause (eliminator, d, -pivot);
  }
  erase_occs (ns);

  if (substitute)
    assert (pushed <= substitute);

  // Unfortunately, we can not use the trick by Niklas Soerensson anymore,
  // which avoids saving all clauses on the extension stack.  This would
  // break our new incremental 'restore' logic.
}